

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

Edge<std::pair<double,_double>_> * __thiscall
Vertex<std::pair<double,_double>_>::addEdge
          (Vertex<std::pair<double,_double>_> *this,Vertex<std::pair<double,_double>_> *dest,
          double cost)

{
  pointer *pppEVar1;
  iterator iVar2;
  Edge<std::pair<double,_double>_> *this_00;
  Edge<std::pair<double,_double>_> *edge;
  Edge<std::pair<double,_double>_> *local_28;
  double local_20;
  
  local_20 = cost;
  this_00 = (Edge<std::pair<double,_double>_> *)operator_new(0x18);
  Edge<std::pair<double,_double>_>::Edge(this_00,this,dest,local_20);
  iVar2._M_current =
       (this->outgoing).
       super__Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_28 = this_00;
  if (iVar2._M_current ==
      (this->outgoing).
      super__Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Edge<std::pair<double,double>>*,std::allocator<Edge<std::pair<double,double>>*>>::
    _M_realloc_insert<Edge<std::pair<double,double>>*const&>
              ((vector<Edge<std::pair<double,double>>*,std::allocator<Edge<std::pair<double,double>>*>>
                *)&this->outgoing,iVar2,&local_28);
  }
  else {
    *iVar2._M_current = this_00;
    pppEVar1 = &(this->outgoing).
                super__Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppEVar1 = *pppEVar1 + 1;
  }
  iVar2._M_current =
       (dest->incoming).
       super__Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (dest->incoming).
      super__Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Edge<std::pair<double,double>>*,std::allocator<Edge<std::pair<double,double>>*>>::
    _M_realloc_insert<Edge<std::pair<double,double>>*const&>
              ((vector<Edge<std::pair<double,double>>*,std::allocator<Edge<std::pair<double,double>>*>>
                *)&dest->incoming,iVar2,&local_28);
  }
  else {
    *iVar2._M_current = local_28;
    pppEVar1 = &(dest->incoming).
                super__Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppEVar1 = *pppEVar1 + 1;
  }
  return local_28;
}

Assistant:

Edge<T>* Vertex<T>::addEdge(Vertex<T> *dest, double cost) {
    Edge<T> *edge = new Edge<T>(this, dest, cost);
    this->outgoing.push_back(edge);
    dest->incoming.push_back(edge);
    return edge;
}